

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_io_blocks
               (NegativeTestContext *ctx)

{
  allocator<char> local_1a9;
  string local_1a8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "GL_EXT_shader_io_blocks features require enabling the extension in 310 es shaders.",
             &local_1a9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  std::operator<<((ostream *)&source,
                  "#version 310 es\nin Data\n{\n\tmediump vec3 a;\n} data;\nvoid main()\n{\n}\n");
  std::__cxx11::stringbuf::str();
  verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1a8,EXPECT_RESULT_FAIL);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void shader_io_blocks (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_EXT_shader_io_blocks features require enabling the extension in 310 es shaders.");
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"in Data\n"
					"{\n"
					"	mediump vec3 a;\n"
					"} data;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}